

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void JX9_FILE_Const(jx9_value *pVal,void *pUserData)

{
  undefined8 *puVar1;
  jx9_vm *pVm;
  
  if (*(int *)((long)pUserData + 0x3f0) == 0) {
    puVar1 = (undefined8 *)0x0;
  }
  else {
    puVar1 = (undefined8 *)
             ((ulong)(uint)((*(int *)((long)pUserData + 0x3f0) + -1) *
                           *(int *)((long)pUserData + 0x3f8)) + *(long *)((long)pUserData + 1000));
  }
  if (puVar1 != (undefined8 *)0x0) {
    jx9_value_string(pVal,(char *)*puVar1,*(int *)(puVar1 + 1));
    return;
  }
  jx9_value_string(pVal,":MEMORY:",8);
  return;
}

Assistant:

static void JX9_FILE_Const(jx9_value *pVal, void *pUserData)
{
	jx9_vm *pVm = (jx9_vm *)pUserData;
	SyString *pFile;
	/* Peek the top entry */
	pFile = (SyString *)SySetPeek(&pVm->aFiles);
	if( pFile == 0 ){
		/* Expand the magic word: ":MEMORY:" */
		jx9_value_string(pVal, ":MEMORY:", (int)sizeof(":MEMORY:")-1);
	}else{
		jx9_value_string(pVal, pFile->zString, pFile->nByte);
	}
}